

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_get_active_buffer_ranges
          (spvc_compiler compiler,spvc_variable_id id,spvc_buffer_range **ranges,size_t *num_ranges)

{
  uint uVar1;
  spvc_context psVar2;
  size_t sVar3;
  size_t sVar4;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> __s;
  BufferRange *r;
  BufferRange *pBVar5;
  BufferRange *pBVar6;
  SmallVector<spvc_buffer_range,_8UL> translated;
  SmallVector<spirv_cross::BufferRange,_8UL> active_ranges;
  undefined1 local_1e8 [224];
  undefined1 local_108 [216];
  
  spirv_cross::Compiler::get_active_buffer_ranges
            ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_108,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id);
  local_1e8._8_8_ = 0;
  local_1e8._16_8_ = 8;
  local_1e8._0_8_ = (spvc_buffer_range *)(local_1e8 + 0x18);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
            ((SmallVector<spvc_buffer_range,_8UL> *)local_1e8,local_108._8_8_);
  if (local_108._8_8_ != 0) {
    pBVar6 = (BufferRange *)(local_108._0_8_ + local_108._8_8_ * 0x18);
    pBVar5 = (BufferRange *)local_108._0_8_;
    do {
      uVar1 = pBVar5->index;
      sVar3 = pBVar5->offset;
      sVar4 = pBVar5->range;
      spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
                ((SmallVector<spvc_buffer_range,_8UL> *)local_1e8,local_1e8._8_8_ + 1);
      ((spvc_buffer_range *)(local_1e8._0_8_ + local_1e8._8_8_ * 0x18))->index = uVar1;
      ((spvc_buffer_range *)(local_1e8._0_8_ + local_1e8._8_8_ * 0x18))->offset = sVar3;
      (&((spvc_buffer_range *)(local_1e8._0_8_ + local_1e8._8_8_ * 0x18))->offset)[1] = sVar4;
      local_1e8._8_8_ = local_1e8._8_8_ + 1;
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar6);
  }
  __s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0xe0);
  memset((void *)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl,0,0xe0);
  *(undefined ***)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_0050ab50;
  *(undefined8 *)
   ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::operator=
            ((SmallVector<spvc_buffer_range,_8UL> *)
             ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_buffer_range,_8UL> *)local_1e8);
  *ranges = *(spvc_buffer_range **)
             ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8);
  *num_ranges = *(size_t *)
                 ((long)__s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 0x10);
  psVar2 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar2->allocations,
            (psVar2->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar3 = (psVar2->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar3]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       __s.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar3 + 1;
  local_1e8._8_8_ = 0;
  if ((spvc_buffer_range *)local_1e8._0_8_ != (spvc_buffer_range *)(local_1e8 + 0x18)) {
    free((void *)local_1e8._0_8_);
  }
  local_108._8_8_ = 0;
  if ((BufferRange *)local_108._0_8_ != (BufferRange *)(local_108 + 0x18)) {
    free((void *)local_108._0_8_);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_active_buffer_ranges(spvc_compiler compiler,
                                                   spvc_variable_id id,
                                                   const spvc_buffer_range **ranges,
                                                   size_t *num_ranges)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto active_ranges = compiler->compiler->get_active_buffer_ranges(id);
		SmallVector<spvc_buffer_range> translated;
		translated.reserve(active_ranges.size());
		for (auto &r : active_ranges)
		{
			spvc_buffer_range trans = { r.index, r.offset, r.range };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_buffer_range>>();
		ptr->buffer = std::move(translated);
		*ranges = ptr->buffer.data();
		*num_ranges = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}